

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

String * __thiscall
kj::anon_unknown_30::SocketAddress::toString(String *__return_storage_ptr__,SocketAddress *this)

{
  sa_family_t sVar1;
  ushort uVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  int osErrorNumber;
  ArrayPtr<const_char> *in_RCX;
  int line;
  char (*in_R8) [2];
  unsigned_short *in_R9;
  kj local_59;
  Fault f;
  char buffer [46];
  
  if (this->wildcard == true) {
    uVar3 = getPort(this);
    buffer[0] = (char)uVar3;
    buffer[1] = (char)(uVar3 >> 8);
    buffer[2] = (char)(uVar3 >> 0x10);
    buffer[3] = (char)(uVar3 >> 0x18);
    str<char_const(&)[3],unsigned_int>
              (__return_storage_ptr__,(kj *)"*:",(char (*) [3])buffer,(uint *)in_RCX);
  }
  else {
    sVar1 = (this->addr).generic.sa_family;
    if (sVar1 == 1) {
      buffer._0_16_ = (undefined1  [16])kj::_::safeUnixPath(&(this->addr).unixDomain,this->addrlen);
      if ((buffer._8_8_ == 0) || (*buffer._0_8_ != '\0')) {
        str<char_const(&)[6],kj::ArrayPtr<char_const>&>
                  (__return_storage_ptr__,(kj *)"unix:",(char (*) [6])buffer,in_RCX);
      }
      else {
        f.exception = (Exception *)(buffer._0_8_ + 1);
        str<char_const(&)[15],kj::ArrayPtr<char_const>>
                  (__return_storage_ptr__,(kj *)"unix-abstract:",(char (*) [15])&f,
                   (ArrayPtr<const_char> *)&f);
      }
    }
    else {
      if (sVar1 == 10) {
        pcVar4 = inet_ntop(10,(void *)((long)&this->addr + 8),buffer,0x2e);
        if (pcVar4 != (char *)0x0) {
          local_59 = (kj)0x5b;
          uVar2 = (this->addr).inet4.sin_port;
          f.exception._0_2_ = uVar2 << 8 | uVar2 >> 8;
          str<char,char(&)[46],char_const(&)[3],unsigned_short>
                    (__return_storage_ptr__,&local_59,buffer,(char (*) [46])"]:",(char (*) [3])&f,
                     in_R9);
          return __return_storage_ptr__;
        }
        piVar5 = __errno_location();
        osErrorNumber = *piVar5;
        line = 0x24f;
      }
      else {
        if (sVar1 != 2) {
          str<char_const(&)[25],unsigned_short_const&,char_const(&)[2]>
                    (__return_storage_ptr__,(kj *)"(unknown address family ",
                     (char (*) [25])&this->addr,(unsigned_short *)0x4f2f80,in_R8);
          return __return_storage_ptr__;
        }
        pcVar4 = inet_ntop(2,(void *)((long)&this->addr + 4),buffer,0x2e);
        if (pcVar4 != (char *)0x0) {
          local_59 = (kj)0x3a;
          uVar2 = (this->addr).inet4.sin_port;
          f.exception._0_2_ = uVar2 << 8 | uVar2 >> 8;
          str<char(&)[46],char,unsigned_short>
                    (__return_storage_ptr__,(kj *)buffer,(char (*) [46])&local_59,(char *)&f,
                     (unsigned_short *)in_R8);
          return __return_storage_ptr__;
        }
        piVar5 = __errno_location();
        osErrorNumber = *piVar5;
        line = 0x246;
      }
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,line,osErrorNumber,"inet_ntop","");
      kj::_::Debug::Fault::~Fault(&f);
      heapString(__return_storage_ptr__,"(inet_ntop error)");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String toString() const {
    if (wildcard) {
      return str("*:", getPort());
    }

    switch (addr.generic.sa_family) {
      case AF_INET: {
        char buffer[INET6_ADDRSTRLEN];
        if (inet_ntop(addr.inet4.sin_family, &addr.inet4.sin_addr,
                      buffer, sizeof(buffer)) == nullptr) {
          KJ_FAIL_SYSCALL("inet_ntop", errno) { break; }
          return heapString("(inet_ntop error)");
        }
        return str(buffer, ':', ntohs(addr.inet4.sin_port));
      }
      case AF_INET6: {
        char buffer[INET6_ADDRSTRLEN];
        if (inet_ntop(addr.inet6.sin6_family, &addr.inet6.sin6_addr,
                      buffer, sizeof(buffer)) == nullptr) {
          KJ_FAIL_SYSCALL("inet_ntop", errno) { break; }
          return heapString("(inet_ntop error)");
        }
        return str('[', buffer, "]:", ntohs(addr.inet6.sin6_port));
      }
      case AF_UNIX: {
        auto path = _::safeUnixPath(&addr.unixDomain, addrlen);
        if (path.size() > 0 && path[0] == '\0') {
          return str("unix-abstract:", path.slice(1, path.size()));
        } else {
          return str("unix:", path);
        }
      }
      default:
        return str("(unknown address family ", addr.generic.sa_family, ")");
    }
  }